

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int client_handle_encrypted_extensions
              (ptls_t *tls,ptls_iovec_t message,ptls_handshake_properties_t *properties)

{
  code *pcVar1;
  ptls_context_t *ctx;
  bool bVar2;
  uint16_t uVar3;
  ptls_handshake_properties_t *ppVar4;
  int iVar5;
  uint8_t *end_00;
  uint8_t *end_01;
  uint8_t *puVar6;
  void *pvVar7;
  uint8_t uVar8;
  undefined4 uVar9;
  uint8_t *puVar10;
  ptls_iovec_t pVar11;
  undefined1 local_160 [8];
  st_decoded_ech_config_t decoded;
  uint8_t *end_4;
  uint8_t *_src_3;
  uint64_t _block_size64_3;
  size_t _block_size_3;
  size_t _capacity_3;
  uint8_t *end_3;
  uint8_t *_src_2;
  uint64_t _block_size64_2;
  size_t _block_size_2;
  size_t _capacity_2;
  size_t local_b8;
  uint8_t *end_2;
  uint8_t *_src_1;
  uint64_t _block_size64_1;
  size_t _block_size_1;
  size_t _capacity_1;
  uint8_t *end_1;
  uint8_t *_src;
  uint64_t _block_size64;
  size_t _block_size;
  size_t _capacity;
  st_ptls_extension_bitmap_t bitmap;
  uint uStack_4c;
  uint8_t server_offered_cert_type;
  int skip_early_data;
  int ret;
  ptls_raw_extension_t *unknown_extensions;
  uint8_t *puStack_38;
  uint16_t type;
  uint8_t *end;
  uint8_t *src;
  ptls_handshake_properties_t *properties_local;
  ptls_t *tls_local;
  ptls_iovec_t message_local;
  
  message_local.base = (uint8_t *)message.len;
  tls_local = (ptls_t *)message.base;
  end = (uint8_t *)((long)&tls_local->ctx + 4);
  puStack_38 = message_local.base + (long)(&tls_local->traffic_protection + -1) + 0x78;
  _skip_early_data = &client_handle_encrypted_extensions::no_unknown_extensions;
  bVar2 = true;
  bitmap.bits._7_1_ = '\0';
  src = (uint8_t *)properties;
  properties_local = (ptls_handshake_properties_t *)tls;
  memset(&_capacity,0,8);
  _block_size = 2;
  if ((ulong)((long)puStack_38 - (long)end) < 2) {
    uStack_4c = 0x32;
  }
  else {
    _block_size64 = 0;
    do {
      end_01 = end + 1;
      _block_size64 = _block_size64 << 8 | (ulong)*end;
      _block_size = _block_size - 1;
      end = end_01;
    } while (_block_size != 0);
    if ((ulong)((long)puStack_38 - (long)end_01) < _block_size64) {
      uStack_4c = 0x32;
    }
    else {
      end_00 = end_01 + _block_size64;
      do {
        while( true ) {
          end = end_01;
          if (end == end_00) {
            if (end == end_00) {
              if (end == puStack_38) {
                uVar8 = '\0';
                if (((byte)(properties_local->field_0).client.negotiated_protocols.list[0xb].len >>
                     5 & 1) != 0) {
                  uVar8 = '\x02';
                }
                if (bitmap.bits._7_1_ == uVar8) {
                  if ((*(byte *)((long)&properties_local[4].field_0 + 0x58) >> 1 & 1) != 0) {
                    if (bVar2) {
                      *(byte *)((long)&properties_local[4].field_0 + 0x58) =
                           *(byte *)((long)&properties_local[4].field_0 + 0x58) & 0xfd;
                    }
                    if (src != (uint8_t *)0x0) {
                      uVar9 = 2;
                      if (bVar2) {
                        uVar9 = 1;
                      }
                      *(undefined4 *)(src + 0x28) = uVar9;
                    }
                  }
                  uStack_4c = report_unknown_extensions
                                        ((ptls_t *)properties_local,
                                         (ptls_handshake_properties_t *)src,_skip_early_data);
                  if (uStack_4c == 0) {
                    ptls__key_schedule_update_hash
                              ((ptls_key_schedule_t *)
                               (properties_local->field_0).server.cookie.additional_data.base,
                               (uint8_t *)tls_local,(size_t)message_local.base,0);
                    uVar9 = 4;
                    if ((*(byte *)&properties_local[3].additional_extensions >> 1 & 1) != 0) {
                      uVar9 = 7;
                    }
                    *(undefined4 *)((long)&properties_local->field_0 + 8) = uVar9;
                    uStack_4c = 0x202;
                  }
                }
                else {
                  uStack_4c = 0x2b;
                }
              }
              else {
                uStack_4c = 0x32;
              }
            }
            else {
              uStack_4c = 0x32;
            }
            goto LAB_0011cf6f;
          }
          uStack_4c = ptls_decode16((uint16_t *)((long)&unknown_extensions + 6),&end,end_00);
          if (uStack_4c != 0) goto LAB_0011cf6f;
          iVar5 = extension_bitmap_testandset
                            ((st_ptls_extension_bitmap_t *)&_capacity,8,unknown_extensions._6_2_);
          ppVar4 = properties_local;
          uVar3 = unknown_extensions._6_2_;
          if (iVar5 == 0) {
            uStack_4c = 0x2f;
            goto LAB_0011cf6f;
          }
          _block_size_1 = 2;
          if ((ulong)((long)end_00 - (long)end) < 2) {
            uStack_4c = 0x32;
            goto LAB_0011cf6f;
          }
          _block_size64_1 = 0;
          do {
            puVar10 = end + 1;
            _block_size64_1 = _block_size64_1 << 8 | (ulong)*end;
            _block_size_1 = _block_size_1 - 1;
            end = puVar10;
          } while (_block_size_1 != 0);
          if ((ulong)((long)end_00 - (long)puVar10) < _block_size64_1) {
            uStack_4c = 0x32;
            goto LAB_0011cf6f;
          }
          end_01 = puVar10 + _block_size64_1;
          if ((properties_local->field_0).client.negotiated_protocols.list[0xf].base !=
              (uint8_t *)0x0) {
            pcVar1 = *(code **)(properties_local->field_0).client.negotiated_protocols.list[0xf].
                               base;
            puVar6 = (properties_local->field_0).client.negotiated_protocols.list[0xf].base;
            pVar11 = ptls_iovec_init(puVar10,(long)end_01 - (long)puVar10);
            _capacity_2 = (size_t)pVar11.base;
            local_b8 = pVar11.len;
            iVar5 = (*pcVar1)(puVar6,ppVar4,8,uVar3,_capacity_2,local_b8);
            uStack_4c = (uint)(iVar5 != 0);
            if (iVar5 != 0) goto LAB_0011cf6f;
          }
          if (unknown_extensions._6_2_ == 0) break;
          if (unknown_extensions._6_2_ == 0x10) {
            _block_size_2 = 2;
            if ((ulong)((long)end_01 - (long)end) < 2) {
              uStack_4c = 0x32;
              goto LAB_0011cf6f;
            }
            _block_size64_2 = 0;
            do {
              puVar10 = end + 1;
              _block_size64_2 = _block_size64_2 << 8 | (ulong)*end;
              _block_size_2 = _block_size_2 - 1;
              end = puVar10;
            } while (_block_size_2 != 0);
            if ((ulong)((long)end_01 - (long)puVar10) < _block_size64_2) {
              uStack_4c = 0x32;
              goto LAB_0011cf6f;
            }
            puVar6 = puVar10 + _block_size64_2;
            _block_size_3 = 1;
            if (puVar6 == puVar10) {
              uStack_4c = 0x32;
              goto LAB_0011cf6f;
            }
            _block_size64_3 = 0;
            do {
              puVar10 = end + 1;
              _block_size64_3 = _block_size64_3 << 8 | (ulong)*end;
              _block_size_3 = _block_size_3 - 1;
              end = puVar10;
            } while (_block_size_3 != 0);
            if ((ulong)((long)puVar6 - (long)puVar10) < _block_size64_3) {
              uStack_4c = 0x32;
              goto LAB_0011cf6f;
            }
            decoded.bytes.len = (size_t)(puVar10 + _block_size64_3);
            if (puVar10 == (uint8_t *)decoded.bytes.len) {
              uStack_4c = 0x32;
              goto LAB_0011cf6f;
            }
            uStack_4c = ptls_set_negotiated_protocol
                                  ((ptls_t *)properties_local,(char *)puVar10,
                                   decoded.bytes.len - (long)puVar10);
            if (uStack_4c != 0) goto LAB_0011cf6f;
            end = (uint8_t *)decoded.bytes.len;
            if ((uint8_t *)decoded.bytes.len != puVar6) {
              uStack_4c = 0x28;
              goto LAB_0011cf6f;
            }
            if ((uint8_t *)decoded.bytes.len != puVar6) {
              uStack_4c = 0x32;
              goto LAB_0011cf6f;
            }
            if ((uint8_t *)decoded.bytes.len != end_01) {
              uStack_4c = 0x32;
              goto LAB_0011cf6f;
            }
          }
          else if (unknown_extensions._6_2_ == 0x14) {
            if ((long)end_01 - (long)end != 1) {
              uStack_4c = 0x32;
              goto LAB_0011cf6f;
            }
            bitmap.bits._7_1_ = *end;
          }
          else if (unknown_extensions._6_2_ == 0x2a) {
            if ((*(byte *)((long)&properties_local[4].field_0 + 0x58) >> 1 & 1) == 0) {
              uStack_4c = 0x2f;
              goto LAB_0011cf6f;
            }
            bVar2 = false;
          }
          else if (unknown_extensions._6_2_ == 0xfe0d) {
            if (((((ulong)properties_local[2].collected_extensions & 1) == 0) &&
                ((*(byte *)&properties_local[2].collected_extensions >> 1 & 1) == 0)) ||
               (iVar5 = ptls_is_ech_handshake
                                  ((ptls_t *)properties_local,(uint8_t *)0x0,(ptls_hpke_kem_t **)0x0
                                   ,(ptls_hpke_cipher_suite_t **)0x0), iVar5 != 0)) {
              uStack_4c = 0x6e;
              goto LAB_0011cf6f;
            }
            ctx = (ptls_context_t *)(properties_local->field_0).client.negotiated_protocols.list;
            pVar11 = ptls_iovec_init(end,(long)end_01 - (long)end);
            uStack_4c = client_decode_ech_config_list
                                  (ctx,(st_decoded_ech_config_t *)local_160,pVar11);
            if (uStack_4c != 0) goto LAB_0011cf6f;
            if (((decoded._0_8_ != 0) && (decoded.public_key.len != 0)) &&
               ((src != (uint8_t *)0x0 && (*(long *)(src + 0x40) != 0)))) {
              pvVar7 = malloc((long)end_01 - (long)end);
              **(undefined8 **)(src + 0x40) = pvVar7;
              if (pvVar7 == (void *)0x0) {
                uStack_4c = 0x201;
                goto LAB_0011cf6f;
              }
              memcpy((void *)**(undefined8 **)(src + 0x40),end,(long)end_01 - (long)end);
              *(long *)(*(long *)(src + 0x40) + 8) = (long)end_01 - (long)end;
            }
          }
          else {
            iVar5 = should_collect_unknown_extension
                              ((ptls_t *)properties_local,(ptls_handshake_properties_t *)src,
                               unknown_extensions._6_2_);
            if (iVar5 != 0) {
              if (_skip_early_data == &client_handle_encrypted_extensions::no_unknown_extensions) {
                _skip_early_data = (ptls_raw_extension_t *)malloc(0x198);
                if (_skip_early_data == (ptls_raw_extension_t *)0x0) {
                  uStack_4c = 0x201;
                  goto LAB_0011cf6f;
                }
                _skip_early_data->type = 0xffff;
              }
              uStack_4c = collect_unknown_extension
                                    ((ptls_t *)properties_local,unknown_extensions._6_2_,end,end_01,
                                     _skip_early_data);
              if (uStack_4c != 0) goto LAB_0011cf6f;
            }
          }
        }
        if (end != end_01) {
          uStack_4c = 0x32;
          goto LAB_0011cf6f;
        }
      } while ((*(long *)((long)&properties_local[2].field_0 + 0x28) != 0) &&
              (iVar5 = ptls_server_name_is_ipaddr
                                 (*(char **)((long)&properties_local[2].field_0 + 0x28)), iVar5 == 0
              ));
      uStack_4c = 0x2f;
    }
  }
LAB_0011cf6f:
  if (_skip_early_data != &client_handle_encrypted_extensions::no_unknown_extensions) {
    free(_skip_early_data);
  }
  return uStack_4c;
}

Assistant:

static int client_handle_encrypted_extensions(ptls_t *tls, ptls_iovec_t message, ptls_handshake_properties_t *properties)
{
    const uint8_t *src = message.base + PTLS_HANDSHAKE_HEADER_SIZE, *const end = message.base + message.len;
    uint16_t type;
    static const ptls_raw_extension_t no_unknown_extensions = {UINT16_MAX};
    ptls_raw_extension_t *unknown_extensions = (ptls_raw_extension_t *)&no_unknown_extensions;
    int ret, skip_early_data = 1;
    uint8_t server_offered_cert_type = PTLS_CERTIFICATE_TYPE_X509;

    decode_extensions(src, end, PTLS_HANDSHAKE_TYPE_ENCRYPTED_EXTENSIONS, &type, {
        if (tls->ctx->on_extension != NULL &&
            (ret = tls->ctx->on_extension->cb(tls->ctx->on_extension, tls, PTLS_HANDSHAKE_TYPE_ENCRYPTED_EXTENSIONS, type,
                                              ptls_iovec_init(src, end - src)) != 0))
            goto Exit;
        switch (type) {
        case PTLS_EXTENSION_TYPE_SERVER_NAME:
            if (src != end) {
                ret = PTLS_ALERT_DECODE_ERROR;
                goto Exit;
            }
            if (!(tls->server_name != NULL && !ptls_server_name_is_ipaddr(tls->server_name))) {
                ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                goto Exit;
            }
            break;
        case PTLS_EXTENSION_TYPE_ALPN:
            ptls_decode_block(src, end, 2, {
                ptls_decode_open_block(src, end, 1, {
                    if (src == end) {
                        ret = PTLS_ALERT_DECODE_ERROR;
                        goto Exit;
                    }
                    if ((ret = ptls_set_negotiated_protocol(tls, (const char *)src, end - src)) != 0)
                        goto Exit;
                    src = end;
                });
                if (src != end) {
                    ret = PTLS_ALERT_HANDSHAKE_FAILURE;
                    goto Exit;
                }
            });
            break;
        case PTLS_EXTENSION_TYPE_EARLY_DATA:
            if (!tls->client.using_early_data) {
                ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                goto Exit;
            }
            skip_early_data = 0;
            break;
        case PTLS_EXTENSION_TYPE_SERVER_CERTIFICATE_TYPE:
            if (end - src != 1) {
                ret = PTLS_ALERT_DECODE_ERROR;
                goto Exit;
            }
            server_offered_cert_type = *src;
            src = end;
            break;
        case PTLS_EXTENSION_TYPE_ENCRYPTED_CLIENT_HELLO: {
            /* accept retry_configs only if we offered ECH but rejected */
            if (!((tls->ech.offered || tls->ech.offered_grease) && !ptls_is_ech_handshake(tls, NULL, NULL, NULL))) {
                ret = PTLS_ALERT_UNSUPPORTED_EXTENSION;
                goto Exit;
            }
            /* parse retry_config, and if it is applicable, provide that to the application */
            struct st_decoded_ech_config_t decoded;
            if ((ret = client_decode_ech_config_list(tls->ctx, &decoded, ptls_iovec_init(src, end - src))) != 0)
                goto Exit;
            if (decoded.kem != NULL && decoded.cipher != NULL && properties != NULL &&
                properties->client.ech.retry_configs != NULL) {
                if ((properties->client.ech.retry_configs->base = malloc(end - src)) == NULL) {
                    ret = PTLS_ERROR_NO_MEMORY;
                    goto Exit;
                }
                memcpy(properties->client.ech.retry_configs->base, src, end - src);
                properties->client.ech.retry_configs->len = end - src;
            }
            src = end;
        } break;
        default:
            if (should_collect_unknown_extension(tls, properties, type)) {
                if (unknown_extensions == &no_unknown_extensions) {
                    if ((unknown_extensions = malloc(sizeof(*unknown_extensions) * (MAX_UNKNOWN_EXTENSIONS + 1))) == NULL) {
                        ret = PTLS_ERROR_NO_MEMORY;
                        goto Exit;
                    }
                    unknown_extensions[0].type = UINT16_MAX;
                }
                if ((ret = collect_unknown_extension(tls, type, src, end, unknown_extensions)) != 0)
                    goto Exit;
            }
            break;
        }
        src = end;
    });

    if (server_offered_cert_type !=
        (tls->ctx->use_raw_public_keys ? PTLS_CERTIFICATE_TYPE_RAW_PUBLIC_KEY : PTLS_CERTIFICATE_TYPE_X509)) {
        ret = PTLS_ALERT_UNSUPPORTED_CERTIFICATE;
        goto Exit;
    }

    if (tls->client.using_early_data) {
        if (skip_early_data)
            tls->client.using_early_data = 0;
        if (properties != NULL)
            properties->client.early_data_acceptance = skip_early_data ? PTLS_EARLY_DATA_REJECTED : PTLS_EARLY_DATA_ACCEPTED;
    }
    if ((ret = report_unknown_extensions(tls, properties, unknown_extensions)) != 0)
        goto Exit;

    ptls__key_schedule_update_hash(tls->key_schedule, message.base, message.len, 0);
    tls->state =
        tls->is_psk_handshake ? PTLS_STATE_CLIENT_EXPECT_FINISHED : PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_REQUEST_OR_CERTIFICATE;
    ret = PTLS_ERROR_IN_PROGRESS;

Exit:
    if (unknown_extensions != &no_unknown_extensions)
        free(unknown_extensions);
    return ret;
}